

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O2

void __thiscall MakefileGenerator::initCompiler(MakefileGenerator *this,Compiler *comp)

{
  byte bVar1;
  _List_node_base *p_Var2;
  ProStringList l;
  bool bVar3;
  QArrayDataPointer<ProString> *this_00;
  long in_FS_OFFSET;
  char *pcVar4;
  Data *in_stack_ffffffffffffff68;
  QArrayDataPointer<ProString> local_80;
  QArrayDataPointer<ProString> local_68 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var2 = (this->project->super_QMakeEvaluator).m_valuemapStack.
           super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
           super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  ProKey::ProKey((ProKey *)local_68,&comp->variable_in);
  this_00 = (QArrayDataPointer<ProString> *)
            QMap<ProKey,_ProStringList>::operator[]
                      ((QMap<ProKey,_ProStringList> *)(p_Var2 + 1),(ProKey *)local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_68);
  bVar3 = QHash<QString,_bool>::contains(&this->init_compiler_already,&comp->variable_in);
  if (!bVar3) {
    local_68[0].d._0_1_ = 1;
    QHash<QString,bool>::emplace<bool_const&>
              ((QHash<QString,bool> *)&this->init_compiler_already,&comp->variable_in,
               (bool *)local_68);
    if (this->no_io == false) {
      bVar1 = (byte)comp->flags;
      local_80.d = this_00->d;
      local_80.ptr = this_00->ptr;
      local_80.size = this_00->size;
      if (local_80.d != (Data *)0x0) {
        LOCK();
        ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pcVar4 = "VPATH_";
      QStringBuilder<const_char_(&)[7],_const_QString_&>::convertTo<QString>
                ((QString *)&stack0xffffffffffffff68,
                 (QStringBuilder<const_char_(&)[7],_const_QString_&> *)&stack0xffffffffffffff58);
      l.super_QList<ProString>.d.ptr = (ProString *)comp;
      l.super_QList<ProString>.d.d = (Data *)pcVar4;
      l.super_QList<ProString>.d.size = (qsizetype)in_stack_ffffffffffffff68;
      findFilesInVPATH((ProStringList *)local_68,this,l,(uchar)&local_80,
                       (QString *)(ulong)(bVar1 >> 3 & 1 | bVar1 >> 1 & 2));
      QArrayDataPointer<ProString>::operator=(this_00,local_68);
      QArrayDataPointer<ProString>::~QArrayDataPointer(local_68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffff68);
      QArrayDataPointer<ProString>::~QArrayDataPointer(&local_80);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void
MakefileGenerator::initCompiler(const MakefileGenerator::Compiler &comp)
{
    ProValueMap &v = project->variables();
    ProStringList &l = v[ProKey(comp.variable_in)];
    // find all the relevant file inputs
    if(!init_compiler_already.contains(comp.variable_in)) {
        init_compiler_already.insert(comp.variable_in, true);
        if(!noIO()) {
            uchar flags = 0;
            if (comp.flags & Compiler::CompilerRemoveNoExist)
                flags |= VPATH_RemoveMissingFiles;
            if (comp.flags & Compiler::CompilerWarnNoExist)
                flags |= VPATH_WarnMissingFiles;
            l = findFilesInVPATH(l, flags, "VPATH_" + comp.variable_in);
        }
    }
}